

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O1

Type * __thiscall
slang::ast::builtins::TimeScaleFunc::checkArguments
          (TimeScaleFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_4)

{
  LanguageVersion LVar1;
  Compilation *pCVar2;
  bool bVar3;
  Diagnostic *this_00;
  Type *pTVar4;
  char *pcVar5;
  long lVar6;
  size_t sVar7;
  string_view arg;
  
  pCVar2 = ((context->scope).ptr)->compilation;
  bVar3 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,
                     (ulong)this->isOptional ^ 1,1);
  lVar6 = 400;
  if (bVar3) {
    if ((this->isOptional == true) && (LVar1 = (pCVar2->options).languageVersion, (int)LVar1 < 1)) {
      this_00 = ASTContext::addDiag(context,(DiagCode)0x20001,range);
      sVar7 = 9;
      if (LVar1 == Default) {
        pcVar5 = "1800-2017";
      }
      else if (LVar1 == v1800_2023) {
        pcVar5 = "1800-2023";
      }
      else {
        pcVar5 = "";
        sVar7 = 0;
      }
      arg._M_str = pcVar5;
      arg._M_len = sVar7;
      Diagnostic::operator<<(this_00,arg);
    }
    lVar6 = 0x158;
    if ((args->_M_extent)._M_extent_value != 0) {
      pTVar4 = (Type *)(ulong)**(uint **)(*args->_M_ptr + 1);
      if ((pTVar4 < (Type *)0x30) && ((0x80000000000aU >> ((ulong)pTVar4 & 0x3f) & 1) != 0)) {
        bVar3 = true;
      }
      else {
        bVar3 = Scope::isUninstantiated((context->scope).ptr);
        if (!bVar3) {
          ASTContext::addDiag(context,(DiagCode)0xb000b,(*args->_M_ptr)->sourceRange);
        }
        pTVar4 = pCVar2->errorType;
        bVar3 = false;
      }
      if (!bVar3) {
        return pTVar4;
      }
    }
  }
  return *(Type **)((long)&(pCVar2->super_BumpAllocator).head + lVar6);
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, isOptional ? 0 : 1, 1))
            return comp.getErrorType();

        if (isOptional) {
            auto languageVersion = comp.languageVersion();
            if (languageVersion < LanguageVersion::v1800_2023)
                context.addDiag(diag::WrongLanguageVersion, range) << toString(languageVersion);
        }

        if (args.size() > 0) {
            auto& sym = *args[0]->as<ArbitrarySymbolExpression>().symbol;
            if (sym.kind != SymbolKind::Instance && sym.kind != SymbolKind::CompilationUnit &&
                sym.kind != SymbolKind::Root) {
                if (!context.scope->isUninstantiated())
                    context.addDiag(diag::ExpectedModuleName, args[0]->sourceRange);
                return comp.getErrorType();
            }
        }

        return comp.getIntType();
    }